

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void xy_x_8tap_32_avx2(uint8_t *src,__m256i *coeffs,__m256i *filt,int16_t *dst)

{
  __m256i src_00;
  __m256i src_01;
  __m256i data;
  __m256i data_00;
  undefined8 *in_RCX;
  __m256i *in_RDX;
  __m256i *in_RSI;
  undefined8 *in_RDI;
  undefined8 uVar1;
  undefined8 uVar2;
  longlong lVar3;
  __m256i d1;
  __m256i d0;
  __m256i r [2];
  __m256i s1_256;
  __m256i s0_256;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 uVar4;
  undefined8 uVar5;
  longlong lVar6;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  longlong in_stack_fffffffffffffef0;
  
  uVar1 = *in_RDI;
  uVar2 = in_RDI[1];
  lVar3 = in_RDI[2];
  data[1] = in_stack_fffffffffffffee0;
  data[0] = (longlong)in_RDI;
  data[2] = in_stack_fffffffffffffee8;
  data[3] = in_stack_fffffffffffffef0;
  x_convolve_8tap_avx2(data,in_RSI,in_RDX);
  data_00[1] = in_stack_fffffffffffffee0;
  data_00[0] = (longlong)in_RDI;
  data_00[2] = in_stack_fffffffffffffee8;
  data_00[3] = in_stack_fffffffffffffef0;
  x_convolve_8tap_avx2(data_00,in_RSI,in_RDX);
  src_00[1] = uVar1;
  src_00[0] = in_stack_fffffffffffffe78;
  src_00[2] = uVar2;
  src_00[3] = lVar3;
  uVar4 = uVar1;
  uVar5 = uVar2;
  lVar6 = lVar3;
  xy_x_round_avx2(src_00);
  src_01[1] = uVar4;
  src_01[0] = uStack_168;
  src_01[2] = uVar5;
  src_01[3] = lVar6;
  xy_x_round_avx2(src_01);
  *in_RCX = uVar1;
  in_RCX[1] = uVar2;
  in_RCX[2] = lVar3;
  in_RCX[3] = uStack_168;
  in_RCX[4] = local_160;
  in_RCX[5] = uStack_158;
  in_RCX[6] = uStack_150;
  in_RCX[7] = uStack_148;
  return;
}

Assistant:

static inline void xy_x_8tap_32_avx2(const uint8_t *const src,
                                     const __m256i coeffs[4],
                                     const __m256i filt[4],
                                     int16_t *const dst) {
  __m256i r[2];

  x_convolve_8tap_32_avx2(src, coeffs, filt, r);
  const __m256i d0 = xy_x_round_avx2(r[0]);
  const __m256i d1 = xy_x_round_avx2(r[1]);
  _mm256_storeu_si256((__m256i *)dst, d0);
  _mm256_storeu_si256((__m256i *)(dst + 16), d1);
}